

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall inject::not_providing::~not_providing(not_providing *this)

{
  not_providing *this_local;
  
  *(undefined ***)this = &PTR__not_providing_0012dcf8;
  std::__cxx11::string::~string((string *)&this->_msg);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~not_providing() throw() { }